

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc_global.h
# Opt level: O0

int Abc_PrimeCudd(uint p)

{
  bool bVar1;
  undefined4 local_10;
  int pn;
  int i;
  uint p_local;
  
  pn = p - 1;
  do {
    pn = pn + 1;
    if ((pn & 1U) == 0) {
      bVar1 = false;
    }
    else {
      bVar1 = true;
      for (local_10 = 3; local_10 * local_10 <= (uint)pn; local_10 = local_10 + 2) {
        if ((uint)pn % local_10 == 0) {
          bVar1 = false;
          break;
        }
      }
    }
    if (bVar1) {
      return pn;
    }
  } while( true );
}

Assistant:

static inline int Abc_PrimeCudd( unsigned int p )
{
    int i,pn;
    p--;
    do {
        p++;
        if (p&1)
        {
            pn = 1;
            i = 3;
            while ((unsigned) (i * i) <= p)
            {
                if (p % (unsigned)i == 0) {
                    pn = 0;
                    break;
                }
                i += 2;
            }
        }
        else
            pn = 0;
    } while (!pn);
    return (int)(p);

}